

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O0

void dsc_xor_group(Dsc_node_t *pOut,Dsc_node_t *ni,Dsc_node_t *nj,int nVars,int TRUTH_WORDS)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint *cubeCof;
  uint *cubeCof_00;
  uint *cubeCof_01;
  uint *cubeCof_02;
  Dsc_node_t *local_68;
  Dsc_node_t *minCCNode;
  int minCCPolarity;
  int minCCSize;
  int xjONSize;
  int xjOFFSize;
  int xiONSize;
  int xiOFFSize;
  uint *xjON;
  uint *xjOFF;
  uint *xiON;
  uint *xiOFF;
  int TRUTH_WORDS_local;
  int nVars_local;
  Dsc_node_t *nj_local;
  Dsc_node_t *ni_local;
  Dsc_node_t *pOut_local;
  
  cubeCof = ni->off;
  cubeCof_00 = ni->on;
  cubeCof_01 = nj->off;
  cubeCof_02 = nj->on;
  uVar1 = *cubeCof;
  uVar2 = *cubeCof_00;
  uVar3 = *cubeCof_01;
  uVar4 = *cubeCof_02;
  concat(pOut->exp,'[',']',ni->exp,1,nj->exp,1);
  bVar5 = (int)uVar2 < (int)uVar1;
  minCCNode._4_4_ = uVar1;
  if (bVar5) {
    minCCNode._4_4_ = uVar2;
  }
  bVar6 = (int)uVar3 < (int)minCCNode._4_4_;
  local_68 = ni;
  if (bVar6) {
    local_68 = nj;
    minCCNode._4_4_ = uVar3;
  }
  bVar7 = (int)uVar4 < (int)minCCNode._4_4_;
  if (bVar7) {
    local_68 = nj;
  }
  if (local_68 == ni) {
    if (!bVar7 && (bVar6 || !bVar5)) {
      pOut->pNegCof = nj->pNegCof;
      cubeCofactor(pOut->pNegCof,cubeCof,TRUTH_WORDS);
      pOut->pPosCof = nj->pPosCof;
      cubeCofactor(pOut->pPosCof,cubeCof,TRUTH_WORDS);
    }
    else {
      pOut->pNegCof = nj->pPosCof;
      cubeCofactor(pOut->pNegCof,cubeCof_00,TRUTH_WORDS);
      pOut->pPosCof = nj->pNegCof;
      cubeCofactor(pOut->pPosCof,cubeCof_00,TRUTH_WORDS);
    }
  }
  else if (!bVar7 && (bVar6 || !bVar5)) {
    pOut->pNegCof = ni->pNegCof;
    cubeCofactor(pOut->pNegCof,cubeCof_01,TRUTH_WORDS);
    pOut->pPosCof = ni->pPosCof;
    cubeCofactor(pOut->pPosCof,cubeCof_01,TRUTH_WORDS);
  }
  else {
    pOut->pNegCof = ni->pPosCof;
    cubeCofactor(pOut->pNegCof,cubeCof_02,TRUTH_WORDS);
    pOut->pPosCof = ni->pNegCof;
    cubeCofactor(pOut->pPosCof,cubeCof_02,TRUTH_WORDS);
  }
  pOut->pBoolDiff = ni->pBoolDiff;
  pOut->off[0] = 0;
  if ((int)(uVar2 + uVar4) < (int)(uVar1 + uVar3)) {
    merge(pOut->off,cubeCof_00);
    merge(pOut->off,cubeCof_02);
  }
  else {
    merge(pOut->off,cubeCof);
    merge(pOut->off,cubeCof_01);
  }
  pOut->on[0] = 0;
  if ((int)(uVar2 + uVar3) < (int)(uVar1 + uVar4)) {
    merge(pOut->on,cubeCof_00);
    merge(pOut->on,cubeCof_01);
  }
  else {
    merge(pOut->on,cubeCof);
    merge(pOut->on,cubeCof_02);
  }
  return;
}

Assistant:

void dsc_xor_group(Dsc_node_t * pOut, Dsc_node_t * ni, Dsc_node_t * nj, int nVars, const int TRUTH_WORDS) {
    //
    const unsigned int * xiOFF = ni->off;
    const unsigned int * xiON = ni->on;
    const unsigned int * xjOFF = nj->off;
    const unsigned int * xjON = nj->on;
    //
    const int xiOFFSize = xiOFF[0];
    const int xiONSize = xiON[0];
    const int xjOFFSize = xjOFF[0];
    const int xjONSize = xjON[0];
    // minCubeCofs
    int minCCSize = xiOFFSize;
    int minCCPolarity = 0;
    Dsc_node_t * minCCNode = ni;
    // expression
    concat(pOut->exp, '[', ']', ni->exp, 1, nj->exp, 1);
    if (minCCSize > xiONSize) {
        minCCSize = xiONSize;
        minCCPolarity = 1;
        //minCCNode = ni;
    }
    if (minCCSize > xjOFFSize) {
        minCCSize = xjOFFSize;
        minCCPolarity = 0;
        minCCNode = nj;
    }
    if (minCCSize > xjONSize) {
        minCCSize = xjONSize;
        minCCPolarity = 1;
        minCCNode = nj;
    }
    //
    if (minCCNode == ni) {
        if (minCCPolarity) {
            // gOFF = xiON, xjON
            pOut->pNegCof = nj->pPosCof;
            cubeCofactor(pOut->pNegCof, xiON, TRUTH_WORDS);
            // gON = xiON, xjOFF
            pOut->pPosCof = nj->pNegCof;
            cubeCofactor(pOut->pPosCof, xiON, TRUTH_WORDS);
        } else {
            // gOFF = xiOFF, xjOFF
            pOut->pNegCof = nj->pNegCof;
            cubeCofactor(pOut->pNegCof, xiOFF, TRUTH_WORDS);
            // gON = xiOFF, xjON
            pOut->pPosCof = nj->pPosCof;
            cubeCofactor(pOut->pPosCof, xiOFF, TRUTH_WORDS);
        }
    }else  {
        if (minCCPolarity) {
            // gOFF = xjON, xiON
            pOut->pNegCof = ni->pPosCof;
            cubeCofactor(pOut->pNegCof, xjON, TRUTH_WORDS);
            // gON = xjON, xiOFF
            pOut->pPosCof = ni->pNegCof;
            cubeCofactor(pOut->pPosCof, xjON, TRUTH_WORDS);
        } else {
            // gOFF = xjOFF, xiOFF
            pOut->pNegCof = ni->pNegCof;
            cubeCofactor(pOut->pNegCof, xjOFF, TRUTH_WORDS);
            // gON = xjOFF, xiON
            pOut->pPosCof = ni->pPosCof;
            cubeCofactor(pOut->pPosCof, xjOFF, TRUTH_WORDS);
        }
    }
    // bool diff
    pOut->pBoolDiff = ni->pBoolDiff;
    // evaluating specs
    // off spec
    pOut->off[0] = 0;
    if ((xiOFFSize+xjOFFSize) <= (xiONSize+xjONSize)) {
        merge(pOut->off, xiOFF);
        merge(pOut->off, xjOFF);
    } else {
        merge(pOut->off, xiON);
        merge(pOut->off, xjON);
    }
    // on spec
    pOut->on[0] = 0;
    if ((xiOFFSize+xjONSize) <= (xiONSize+xjOFFSize)) {
        merge(pOut->on, xiOFF);
        merge(pOut->on, xjON);
    } else {
        merge(pOut->on, xiON);
        merge(pOut->on, xjOFF);
    }
}